

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestTestHelpers.hpp
# Opt level: O0

bool testAccEval<float,GridMethodFast>
               (vector<double,_std::allocator<double>_> *x,
               vector<double,_std::allocator<double>_> *y,int numx,double tolerance,
               TasmanianSparseGrid *grid,string *message)

{
  allocator<float> *this;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  float *pfVar4;
  float *y_00;
  double err;
  string local_e8;
  int local_c4;
  undefined1 local_c0 [4];
  int i;
  Wrapper2D<float> wy;
  Wrapper2D<const_float> wx;
  vector<float,_std::allocator<float>_> local_98;
  vector<float,_std::allocator<float>_> *local_70;
  vector<float,_std::allocator<float>_> *test_x;
  vector<float,_std::allocator<float>_> temp_x;
  vector<float,_std::allocator<float>_> test_y;
  string *message_local;
  TasmanianSparseGrid *grid_local;
  double tolerance_local;
  int numx_local;
  vector<double,_std::allocator<double>_> *y_local;
  vector<double,_std::allocator<double>_> *x_local;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &temp_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&test_x);
  iVar2 = TasGrid::TasmanianSparseGrid::getNumDimensions(grid);
  sVar3 = TasGrid::Utils::size_mult<int,int>(iVar2,numx);
  local_70 = getVector(x,(vector<float,_std::allocator<float>_> *)&test_x,sVar3);
  iVar2 = TasGrid::TasmanianSparseGrid::getNumOutputs(grid);
  sVar3 = TasGrid::Utils::size_mult<int,int>(numx,iVar2);
  this = (allocator<float> *)((long)&wx.data + 7);
  std::allocator<float>::allocator(this);
  std::vector<float,_std::allocator<float>_>::vector(&local_98,sVar3,this);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &temp_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_98);
  std::vector<float,_std::allocator<float>_>::~vector(&local_98);
  std::allocator<float>::~allocator((allocator<float> *)((long)&wx.data + 7));
  iVar2 = TasGrid::TasmanianSparseGrid::getNumDimensions(grid);
  pfVar4 = std::vector<float,_std::allocator<float>_>::data(local_70);
  TasGrid::Utils::Wrapper2D<const_float>::Wrapper2D((Wrapper2D<const_float> *)&wy.data,iVar2,pfVar4)
  ;
  iVar2 = TasGrid::TasmanianSparseGrid::getNumOutputs(grid);
  pfVar4 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)
                      &temp_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  TasGrid::Utils::Wrapper2D<float>::Wrapper2D((Wrapper2D<float> *)local_c0,iVar2,pfVar4);
  for (local_c4 = 0; local_c4 < numx; local_c4 = local_c4 + 1) {
    pfVar4 = TasGrid::Utils::Wrapper2D<const_float>::getStrip
                       ((Wrapper2D<const_float> *)&wy.data,local_c4);
    y_00 = TasGrid::Utils::Wrapper2D<float>::getStrip((Wrapper2D<float> *)local_c0,local_c4);
    TasGrid::TasmanianSparseGrid::evaluateFast<float>(grid,pfVar4,y_00);
  }
  TasGrid::Utils::Wrapper2D<float>::~Wrapper2D((Wrapper2D<float> *)local_c0);
  TasGrid::Utils::Wrapper2D<const_float>::~Wrapper2D((Wrapper2D<const_float> *)&wy.data);
  iVar2 = TasGrid::TasmanianSparseGrid::getNumOutputs(grid);
  sVar3 = TasGrid::Utils::size_mult<int,int>(numx,iVar2);
  err = err1<std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>>
                  (sVar3,(vector<float,_std::allocator<float>_> *)
                         &temp_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,y);
  std::__cxx11::string::string((string *)&local_e8,(string *)message);
  bVar1 = testPass(err,tolerance,&local_e8,grid);
  std::__cxx11::string::~string((string *)&local_e8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&test_x);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &temp_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return bVar1;
}

Assistant:

bool testAccEval(std::vector<double> const &x, std::vector<double> const &y, int numx, double tolerance, TasmanianSparseGrid &grid, std::string message){
    std::vector<T> test_y, temp_x;
    std::vector<T> const &test_x = getVector(x, temp_x, Utils::size_mult(grid.getNumDimensions(), numx));

    if (std::is_same<EvalMethod, GridMethodBatch>::value){
        grid.evaluateBatch(test_x, test_y);
    }else if (std::is_same<EvalMethod, GridMethodFast>::value){
        test_y = std::vector<T>(Utils::size_mult(numx, grid.getNumOutputs()));
        Utils::Wrapper2D<T const> wx(grid.getNumDimensions(), test_x.data());
        Utils::Wrapper2D<T> wy(grid.getNumOutputs(), test_y.data());
        for(int i=0; i<numx; i++)
            grid.evaluateFast(wx.getStrip(i), wy.getStrip(i));
    }
    return testPass(err1(Utils::size_mult(numx, grid.getNumOutputs()), test_y, y), tolerance, message, grid);
}